

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O0

_Bool ckh_new(tsd_t *tsd,ckh_t *ckh,size_t minitems,ckh_hash_t *hash,ckh_keycomp_t *keycomp)

{
  byte bVar1;
  uint uVar2;
  tsdn_t *tsdn;
  rtree_t *prVar3;
  size_t sVar4;
  long lVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  arena_t *arena;
  undefined8 in_RCX;
  ulong in_RDX;
  undefined8 *in_RSI;
  undefined1 *in_RDI;
  undefined8 in_R8;
  uint lg_mincells;
  size_t usize;
  size_t mincells;
  _Bool ret;
  size_t usize_1;
  void *ret_7;
  size_t ret_4;
  size_t ret_1;
  size_t usize_3;
  size_t delta_mask_1;
  size_t delta_1;
  size_t lg_delta_1;
  size_t x_1;
  size_t lg_ceil_1;
  size_t lg_tmin_1;
  size_t usize_2;
  size_t delta_mask;
  size_t delta;
  size_t lg_delta;
  size_t x;
  size_t lg_ceil;
  size_t lg_tmin;
  size_t ret_3;
  size_t ret_6;
  szind_t ret_2;
  szind_t ret_5;
  tsd_t *tsd_1;
  uint8_t state;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_leaf_elm_t *elm;
  uint8_t state_1;
  rtree_leaf_elm_t *elm_1;
  uintptr_t bits;
  uintptr_t subkey_2;
  rtree_leaf_elm_t *leaf_2;
  uint i;
  uintptr_t subkey_1;
  rtree_leaf_elm_t *leaf_1;
  uintptr_t subkey;
  rtree_leaf_elm_t *leaf;
  uintptr_t leafkey;
  size_t slot;
  uint maskbits;
  uint cumbits;
  uint ptrbits;
  uintptr_t mask;
  uint maskbits_1;
  uint cumbits_1;
  uint ptrbits_1;
  uintptr_t mask_1;
  uint maskbits_2;
  uint shiftbits;
  uint cumbits_2;
  uint ptrbits_2;
  uintptr_t mask_2;
  uint maskbits_3;
  uint shiftbits_1;
  uint cumbits_3;
  uint ptrbits_3;
  uintptr_t mask_3;
  uint maskbits_4;
  uint shiftbits_2;
  uint cumbits_4;
  uint ptrbits_4;
  void *result;
  szind_t szind;
  rtree_ctx_t *rtree_ctx_1;
  rtree_ctx_t rtree_ctx_fallback_1;
  uint8_t state_2;
  rtree_leaf_elm_t *elm_2;
  rtree_leaf_elm_t *elm_3;
  uintptr_t subkey_5;
  rtree_leaf_elm_t *leaf_5;
  uint i_1;
  uintptr_t subkey_4;
  rtree_leaf_elm_t *leaf_4;
  uintptr_t subkey_3;
  rtree_leaf_elm_t *leaf_3;
  uintptr_t leafkey_1;
  size_t slot_1;
  uint maskbits_5;
  uint cumbits_5;
  uint ptrbits_5;
  uintptr_t mask_4;
  uint maskbits_6;
  uint cumbits_6;
  uint ptrbits_6;
  uintptr_t mask_5;
  uint maskbits_7;
  uint shiftbits_3;
  uint cumbits_7;
  uint ptrbits_7;
  uintptr_t mask_6;
  uint maskbits_8;
  uint shiftbits_4;
  uint cumbits_8;
  uint ptrbits_8;
  uintptr_t mask_7;
  uint maskbits_9;
  uint shiftbits_5;
  uint cumbits_9;
  uint ptrbits_9;
  size_t ret_8;
  uintptr_t bits_1;
  void *result_1;
  undefined4 in_stack_fffffffffffff558;
  undefined4 in_stack_fffffffffffff55c;
  tsd_t *in_stack_fffffffffffff560;
  extent_t *in_stack_fffffffffffff570;
  undefined1 zero;
  size_t in_stack_fffffffffffff5a8;
  rtree_t *in_stack_fffffffffffff5b0;
  arena_t *in_stack_fffffffffffff5b8;
  rtree_t *in_stack_fffffffffffff5c0;
  undefined2 uVar9;
  undefined4 in_stack_fffffffffffff5d0;
  int iVar10;
  _Bool local_a11;
  rtree_t *local_9e8;
  rtree_t *local_9d0;
  rtree_t *local_978;
  rtree_t *local_968;
  rtree_t *local_908;
  rtree_t *local_900;
  ulong local_8c0;
  rtree_t *local_8b8;
  witness_tsdn_t *local_868;
  rtree_ctx_t local_7f8;
  void *local_678;
  undefined1 *local_670;
  rtree_ctx_t *local_668;
  rtree_ctx_t *local_658;
  rtree_leaf_elm_t *local_640;
  byte local_631;
  void *local_630;
  rtree_ctx_t *local_628;
  rtree_t *local_620;
  undefined1 *local_618;
  ulong local_610;
  undefined1 local_5f9;
  rtree_leaf_elm_t *local_5e0;
  byte local_5d1;
  void *local_5d0;
  rtree_ctx_t *local_5c8;
  rtree_t *local_5c0;
  undefined1 *local_5b8;
  rtree_leaf_elm_t *local_5b0;
  void *local_5a8;
  byte local_599;
  rtree_leaf_elm_t *local_598;
  rtree_t *local_590;
  undefined1 *local_588;
  ulong local_580;
  rtree_leaf_elm_t *local_578;
  uint local_56c;
  ulong local_568;
  rtree_leaf_elm_t *local_560;
  ulong local_558;
  rtree_leaf_elm_t *local_550;
  uintptr_t local_548;
  ulong local_540;
  undefined1 local_532;
  undefined1 local_531;
  void *local_530;
  rtree_ctx_t *local_528;
  rtree_t *local_520;
  undefined1 *local_518;
  rtree_leaf_elm_t *local_510;
  undefined4 local_504;
  undefined4 local_500;
  undefined4 local_4fc;
  void *local_4f8;
  undefined8 local_4f0;
  undefined4 local_4e4;
  undefined4 local_4e0;
  undefined4 local_4dc;
  void *local_4d8;
  undefined8 local_4d0;
  uint local_4c4;
  undefined4 local_4c0;
  uint local_4bc;
  undefined4 local_4b8;
  undefined4 local_4b4;
  void *local_4b0;
  undefined8 local_4a8;
  uint local_49c;
  undefined4 local_498;
  uint local_494;
  undefined4 local_490;
  undefined4 local_48c;
  void *local_488;
  undefined8 local_480;
  uint local_474;
  undefined4 local_470;
  uint local_46c;
  undefined4 local_468;
  undefined4 local_464;
  void *local_460;
  byte local_451;
  rtree_leaf_elm_t *local_450;
  rtree_t *local_448;
  undefined1 *local_440;
  void *local_438;
  uint local_42c;
  rtree_leaf_elm_t *local_428;
  uint local_420;
  int local_41c;
  void *local_418;
  uint local_40c;
  rtree_ctx_t *local_408;
  rtree_ctx_t local_400;
  void *local_280;
  undefined1 *local_278;
  rtree_ctx_t *local_270;
  rtree_ctx_t *local_260;
  undefined1 local_239;
  rtree_leaf_elm_t *local_220;
  byte local_211;
  void *local_210;
  rtree_ctx_t *local_208;
  rtree_t *local_200;
  undefined1 *local_1f8;
  uint local_1ec;
  rtree_leaf_elm_t *local_1e8;
  byte local_1d9;
  void *local_1d8;
  rtree_ctx_t *local_1d0;
  rtree_t *local_1c8;
  undefined1 *local_1c0;
  rtree_leaf_elm_t *local_1b8;
  ulong local_1b0;
  rtree_leaf_elm_t *local_1a8;
  uint local_19c;
  ulong local_198;
  rtree_leaf_elm_t *local_190;
  ulong local_188;
  rtree_leaf_elm_t *local_180;
  uintptr_t local_178;
  ulong local_170;
  undefined1 local_162;
  undefined1 local_161;
  void *local_160;
  rtree_ctx_t *local_158;
  rtree_t *local_150;
  undefined1 *local_148;
  rtree_leaf_elm_t *local_140;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 local_12c;
  void *local_128;
  undefined8 local_120;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 local_10c;
  void *local_108;
  undefined8 local_100;
  uint local_f4;
  undefined4 local_f0;
  uint local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  void *local_e0;
  undefined8 local_d8;
  uint local_cc;
  undefined4 local_c8;
  uint local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  void *local_b8;
  undefined8 local_b0;
  uint local_a4;
  undefined4 local_a0;
  uint local_9c;
  undefined4 local_98;
  undefined4 local_94;
  void *local_90;
  uint local_84;
  size_t local_80;
  uint local_74;
  void *local_70;
  byte local_61;
  rtree_leaf_elm_t *local_60;
  rtree_t *local_58;
  undefined1 *local_50;
  byte local_41;
  rtree_leaf_elm_t *local_40;
  rtree_t *local_38;
  undefined1 *local_30;
  void *local_28;
  uint local_1c;
  rtree_leaf_elm_t *local_18;
  uint local_10;
  int local_c;
  void *local_8;
  
  *in_RSI = 0x2a;
  in_RSI[1] = 0;
  tsdn = (tsdn_t *)((in_RDX + (3 - in_RDX % 3)) / 3 << 2);
  for (iVar10 = 2; (tsdn_t *)(1L << ((byte)iVar10 & 0x3f)) < tsdn; iVar10 = iVar10 + 1) {
  }
  *(int *)(in_RSI + 2) = iVar10 + -2;
  *(int *)((long)in_RSI + 0x14) = iVar10 + -2;
  in_RSI[3] = in_RCX;
  in_RSI[4] = in_R8;
  prVar3 = (rtree_t *)(0x10L << ((byte)iVar10 & 0x3f));
  if (prVar3 < (rtree_t *)0x3801) {
    local_8c0 = (ulong)((long)&(prVar3->init_lock).field_0 + 0x3fU) & 0xffffffffffffffc0;
    if (local_8c0 < 0x1001) {
      local_978 = (rtree_t *)sz_index2size_tab[sz_size2index_tab[local_8c0 + 7 >> 3]];
    }
    else {
      if (local_8c0 < 0x7000000000000001) {
        if (local_8c0 == 0) {
          local_8c0 = 1;
        }
        if (local_8c0 < 9) {
          sVar4 = pow2_ceil_zu(0x12b0de);
          uVar2 = lg_floor(sVar4);
          if (uVar2 < 3) {
            bVar1 = 3;
          }
          else {
            bVar1 = (byte)uVar2 & 0x3f;
          }
          in_stack_fffffffffffff5c0 = (rtree_t *)(1L << bVar1);
          local_8b8 = in_stack_fffffffffffff5c0;
        }
        else {
          uVar2 = lg_floor(local_8c0 * 2 - 1);
          if ((ulong)uVar2 < 7) {
            in_stack_fffffffffffff5b8 = (arena_t *)0x4;
          }
          else {
            in_stack_fffffffffffff5b8 = (arena_t *)((ulong)uVar2 - 3);
          }
          uVar7 = (1L << ((byte)in_stack_fffffffffffff5b8 & 0x3f)) - 1;
          local_8b8 = (rtree_t *)(local_8c0 + uVar7 & (uVar7 ^ 0xffffffffffffffff));
        }
      }
      else {
        local_8b8 = (rtree_t *)0x0;
      }
      local_978 = local_8b8;
    }
    if (local_978 < (rtree_t *)0x4000) {
      local_9d0 = local_978;
      goto LAB_0012b579;
    }
  }
  if (prVar3 < (rtree_t *)0x4001) {
    local_9e8 = (rtree_t *)0x4000;
  }
  else {
    if (prVar3 < (rtree_t *)0x1001) {
      local_968 = (rtree_t *)
                  sz_index2size_tab
                  [sz_size2index_tab[(ulong)((long)&(prVar3->init_lock).field_0 + 7U) >> 3]];
    }
    else {
      if (prVar3 < (rtree_t *)0x7000000000000001) {
        local_908 = prVar3;
        if (prVar3 == (rtree_t *)0x0) {
          local_908 = (rtree_t *)0x1;
        }
        if (local_908 < (rtree_t *)0x9) {
          sVar4 = pow2_ceil_zu(0x12b3c6);
          uVar2 = lg_floor(sVar4);
          if (uVar2 < 3) {
            bVar1 = 3;
          }
          else {
            bVar1 = (byte)uVar2 & 0x3f;
          }
          in_stack_fffffffffffff5b0 = (rtree_t *)(1L << bVar1);
          local_900 = in_stack_fffffffffffff5b0;
        }
        else {
          uVar2 = lg_floor((long)local_908 * 2 - 1);
          if ((ulong)uVar2 < 7) {
            in_stack_fffffffffffff5a8 = 4;
          }
          else {
            in_stack_fffffffffffff5a8 = (ulong)uVar2 - 3;
          }
          lVar5 = 1L << ((byte)in_stack_fffffffffffff5a8 & 0x3f);
          local_900 = (rtree_t *)
                      ((ulong)((long)local_908->root + lVar5 + -0x71) &
                      (lVar5 - 1U ^ 0xffffffffffffffff));
        }
      }
      else {
        local_900 = (rtree_t *)0x0;
      }
      local_968 = local_900;
    }
    local_9e8 = local_968;
    if (local_968 < prVar3) {
      local_9d0 = (rtree_t *)0x0;
      goto LAB_0012b579;
    }
  }
  if ((rtree_t *)(local_9e8->root + 0x1f2) < local_9e8) {
    local_9d0 = (rtree_t *)0x0;
  }
  else {
    local_9d0 = local_9e8;
  }
LAB_0012b579:
  zero = local_9d0 == (rtree_t *)0x0 || (rtree_t *)0x7000000000000000 < local_9d0;
  if (local_9d0 == (rtree_t *)0x0 || (rtree_t *)0x7000000000000000 < local_9d0) {
    local_a11 = true;
  }
  else {
    prVar3 = local_9d0;
    arena_ichoose(in_stack_fffffffffffff560,
                  (arena_t *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    if (in_RDI == (undefined1 *)0x0) {
      local_868 = (witness_tsdn_t *)0x0;
    }
    else {
      local_868 = (witness_tsdn_t *)(in_RDI + 0x1838);
    }
    witness_assert_depth_to_rank(local_868,0xc,0);
    pvVar6 = arena_palloc((tsdn_t *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                          (size_t)in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,(_Bool)zero,
                          (tcache_t *)local_9d0);
    uVar9 = (undefined2)((ulong)in_stack_fffffffffffff5c0 >> 0x30);
    if (pvVar6 != (void *)0x0) {
      local_668 = &local_7f8;
      local_678 = pvVar6;
      local_670 = in_RDI;
      if (in_RDI == (undefined1 *)0x0) {
        rtree_ctx_data_init(local_668);
        local_658 = local_668;
      }
      else {
        local_5f9 = *in_RDI;
        local_658 = (rtree_ctx_t *)(in_RDI + 0x30);
      }
      local_618 = local_670;
      local_620 = &extents_rtree;
      local_628 = local_658;
      local_630 = local_678;
      local_631 = 1;
      local_5b8 = local_670;
      local_5c0 = &extents_rtree;
      local_5c8 = local_658;
      local_5d0 = local_678;
      local_5d1 = 1;
      local_518 = local_670;
      local_520 = &extents_rtree;
      local_528 = local_658;
      local_530 = local_678;
      local_531 = 1;
      local_532 = 0;
      local_4f8 = local_678;
      local_4fc = 0x40;
      local_500 = 0x22;
      local_504 = 0x1e;
      uVar7 = (ulong)local_678 >> 0x1e & 0xf;
      local_4d8 = local_678;
      local_4dc = 0x40;
      local_4e0 = 0x22;
      local_4e4 = 0x1e;
      local_4f0 = 0xffffffffc0000000;
      uVar8 = (ulong)local_678 & 0xffffffffc0000000;
      local_548 = uVar8;
      local_540 = uVar7;
      if (local_658->cache[uVar7].leafkey == uVar8) {
        local_550 = local_658->cache[uVar7].leaf;
        local_4b0 = local_678;
        local_4b4 = 1;
        local_4b8 = 0x40;
        local_4bc = 0x34;
        local_4c0 = 0xc;
        local_4c4 = 0x12;
        local_4d0 = 0x3ffff;
        local_558 = (ulong)local_678 >> 0xc & 0x3ffff;
        local_510 = local_550 + local_558;
      }
      else if (local_658->l2_cache[0].leafkey == uVar8) {
        local_560 = local_658->l2_cache[0].leaf;
        local_658->l2_cache[0].leafkey = local_658->cache[uVar7].leafkey;
        local_528->l2_cache[0].leaf = local_528->cache[local_540].leaf;
        local_528->cache[local_540].leafkey = local_548;
        local_528->cache[local_540].leaf = local_560;
        local_488 = local_530;
        local_48c = 1;
        local_490 = 0x40;
        local_494 = 0x34;
        local_498 = 0xc;
        local_49c = 0x12;
        local_4a8 = 0x3ffff;
        local_568 = (ulong)local_530 >> 0xc & 0x3ffff;
        local_510 = local_560 + local_568;
      }
      else {
        for (local_56c = 1; local_56c < 8; local_56c = local_56c + 1) {
          if (local_658->l2_cache[local_56c].leafkey == uVar8) {
            local_578 = local_658->l2_cache[local_56c].leaf;
            if (local_56c == 0) {
              local_658->l2_cache[0].leafkey = local_658->cache[uVar7].leafkey;
              local_528->l2_cache[0].leaf = local_528->cache[local_540].leaf;
            }
            else {
              local_658->l2_cache[local_56c].leafkey = local_658->l2_cache[local_56c - 1].leafkey;
              local_658->l2_cache[local_56c].leaf = local_658->l2_cache[local_56c - 1].leaf;
              local_658->l2_cache[local_56c - 1].leafkey = local_658->cache[uVar7].leafkey;
              local_658->l2_cache[local_56c - 1].leaf = local_658->cache[uVar7].leaf;
            }
            local_528->cache[local_540].leafkey = local_548;
            local_528->cache[local_540].leaf = local_578;
            local_460 = local_530;
            local_464 = 1;
            local_468 = 0x40;
            local_46c = 0x34;
            local_470 = 0xc;
            local_474 = 0x12;
            local_480 = 0x3ffff;
            local_580 = (ulong)local_530 >> 0xc & 0x3ffff;
            local_510 = local_578 + local_580;
            goto LAB_0012c0a0;
          }
        }
        local_510 = rtree_leaf_elm_lookup_hard
                              (tsdn,prVar3,(rtree_ctx_t *)CONCAT44(iVar10,in_stack_fffffffffffff5d0)
                               ,in_RDX,SUB21((ushort)uVar9 >> 8,0),SUB21(uVar9,0));
      }
LAB_0012c0a0:
      local_5e0 = local_510;
      if (((local_5d1 & 1) == 0) && (local_510 == (rtree_leaf_elm_t *)0x0)) {
        local_5b0 = (rtree_leaf_elm_t *)0x0;
      }
      else {
        local_5b0 = local_510;
      }
      local_640 = local_5b0;
      if (((local_631 & 1) == 0) && (local_5b0 == (rtree_leaf_elm_t *)0x0)) {
        local_610 = 0;
      }
      else {
        local_588 = local_618;
        local_590 = local_620;
        local_598 = local_5b0;
        local_599 = local_631 & 1;
        local_440 = local_618;
        local_448 = local_620;
        local_450 = local_5b0;
        local_42c = (byte)~local_599 & 1;
        local_428 = local_5b0;
        switch(local_42c) {
        case 0:
          local_41c = 0;
          break;
        case 1:
          local_41c = 2;
        }
        if (local_41c - 1U < 2) {
          local_438 = (local_5b0->le_bits).repr;
        }
        else if (local_41c == 5) {
          local_438 = (local_5b0->le_bits).repr;
        }
        else {
          local_438 = (local_5b0->le_bits).repr;
        }
        local_5a8 = local_438;
        local_418 = local_438;
        local_610 = ((long)local_438 << 0x10) >> 0x10 & 0xfffffffffffffffe;
        local_451 = local_599;
        local_420 = local_42c;
      }
      arena = extent_arena_get(in_stack_fffffffffffff570);
      local_270 = &local_400;
      local_280 = pvVar6;
      local_278 = in_RDI;
      if (in_RDI == (undefined1 *)0x0) {
        rtree_ctx_data_init(local_270);
        local_260 = local_270;
      }
      else {
        local_239 = *in_RDI;
        local_260 = (rtree_ctx_t *)(in_RDI + 0x30);
      }
      local_408 = local_260;
      local_1f8 = local_278;
      local_200 = &extents_rtree;
      local_208 = local_260;
      local_210 = local_280;
      local_211 = 1;
      local_1c0 = local_278;
      local_1c8 = &extents_rtree;
      local_1d0 = local_260;
      local_1d8 = local_280;
      local_1d9 = 1;
      local_148 = local_278;
      local_150 = &extents_rtree;
      local_158 = local_260;
      local_160 = local_280;
      local_161 = 1;
      local_162 = 0;
      local_128 = local_280;
      local_12c = 0x40;
      local_130 = 0x22;
      local_134 = 0x1e;
      uVar7 = (ulong)local_280 >> 0x1e & 0xf;
      local_108 = local_280;
      local_10c = 0x40;
      local_110 = 0x22;
      local_114 = 0x1e;
      local_120 = 0xffffffffc0000000;
      uVar8 = (ulong)local_280 & 0xffffffffc0000000;
      local_178 = uVar8;
      local_170 = uVar7;
      if (local_260->cache[uVar7].leafkey == uVar8) {
        local_180 = local_260->cache[uVar7].leaf;
        local_e0 = local_280;
        local_e4 = 1;
        local_e8 = 0x40;
        local_ec = 0x34;
        local_f0 = 0xc;
        local_f4 = 0x12;
        local_100 = 0x3ffff;
        local_188 = (ulong)local_280 >> 0xc & 0x3ffff;
        local_140 = local_180 + local_188;
      }
      else if (local_260->l2_cache[0].leafkey == uVar8) {
        local_190 = local_260->l2_cache[0].leaf;
        local_260->l2_cache[0].leafkey = local_260->cache[uVar7].leafkey;
        local_158->l2_cache[0].leaf = local_158->cache[local_170].leaf;
        local_158->cache[local_170].leafkey = local_178;
        local_158->cache[local_170].leaf = local_190;
        local_b8 = local_160;
        local_bc = 1;
        local_c0 = 0x40;
        local_c4 = 0x34;
        local_c8 = 0xc;
        local_cc = 0x12;
        local_d8 = 0x3ffff;
        local_198 = (ulong)local_160 >> 0xc & 0x3ffff;
        local_140 = local_190 + local_198;
      }
      else {
        for (local_19c = 1; local_19c < 8; local_19c = local_19c + 1) {
          if (local_260->l2_cache[local_19c].leafkey == uVar8) {
            local_1a8 = local_260->l2_cache[local_19c].leaf;
            if (local_19c == 0) {
              local_260->l2_cache[0].leafkey = local_260->cache[uVar7].leafkey;
              local_158->l2_cache[0].leaf = local_158->cache[local_170].leaf;
            }
            else {
              local_260->l2_cache[local_19c].leafkey = local_260->l2_cache[local_19c - 1].leafkey;
              local_260->l2_cache[local_19c].leaf = local_260->l2_cache[local_19c - 1].leaf;
              local_260->l2_cache[local_19c - 1].leafkey = local_260->cache[uVar7].leafkey;
              local_260->l2_cache[local_19c - 1].leaf = local_260->cache[uVar7].leaf;
            }
            local_158->cache[local_170].leafkey = local_178;
            local_158->cache[local_170].leaf = local_1a8;
            local_90 = local_160;
            local_94 = 1;
            local_98 = 0x40;
            local_9c = 0x34;
            local_a0 = 0xc;
            local_a4 = 0x12;
            local_b0 = 0x3ffff;
            local_1b0 = (ulong)local_160 >> 0xc & 0x3ffff;
            local_140 = local_1a8 + local_1b0;
            goto LAB_0012cbda;
          }
        }
        local_140 = rtree_leaf_elm_lookup_hard
                              (tsdn,prVar3,(rtree_ctx_t *)CONCAT44(iVar10,in_stack_fffffffffffff5d0)
                               ,in_RDX,SUB21((ushort)uVar9 >> 8,0),SUB21(uVar9,0));
      }
LAB_0012cbda:
      local_1e8 = local_140;
      if (((local_1d9 & 1) == 0) && (local_140 == (rtree_leaf_elm_t *)0x0)) {
        local_1b8 = (rtree_leaf_elm_t *)0x0;
      }
      else {
        local_1b8 = local_140;
      }
      local_220 = local_1b8;
      if (((local_211 & 1) == 0) && (local_1b8 == (rtree_leaf_elm_t *)0x0)) {
        local_1ec = 0xe8;
      }
      else {
        local_50 = local_1f8;
        local_58 = local_200;
        local_60 = local_1b8;
        local_61 = local_211 & 1;
        local_30 = local_1f8;
        local_38 = local_200;
        local_40 = local_1b8;
        local_1c = (byte)~local_61 & 1;
        local_18 = local_1b8;
        switch(local_1c) {
        case 0:
          local_c = 0;
          break;
        case 1:
          local_c = 2;
        }
        if (local_c - 1U < 2) {
          local_28 = (local_1b8->le_bits).repr;
        }
        else if (local_c == 5) {
          local_28 = (local_1b8->le_bits).repr;
        }
        else {
          local_28 = (local_1b8->le_bits).repr;
        }
        local_70 = local_28;
        local_8 = local_28;
        local_1ec = (uint)(ushort)((ulong)local_28 >> 0x30);
        local_41 = local_61;
        local_10 = local_1c;
      }
      local_40c = local_1ec;
      local_84 = local_1ec;
      local_74 = local_1ec;
      local_80 = sz_index2size_tab[local_1ec];
      arena_internal_add(arena,local_80);
    }
    in_RSI[5] = pvVar6;
    if (in_RSI[5] == 0) {
      local_a11 = true;
    }
    else {
      local_a11 = false;
    }
  }
  return local_a11;
}

Assistant:

bool
ckh_new(tsd_t *tsd, ckh_t *ckh, size_t minitems, ckh_hash_t *hash,
    ckh_keycomp_t *keycomp) {
	bool ret;
	size_t mincells, usize;
	unsigned lg_mincells;

	assert(minitems > 0);
	assert(hash != NULL);
	assert(keycomp != NULL);

#ifdef CKH_COUNT
	ckh->ngrows = 0;
	ckh->nshrinks = 0;
	ckh->nshrinkfails = 0;
	ckh->ninserts = 0;
	ckh->nrelocs = 0;
#endif
	ckh->prng_state = 42; /* Value doesn't really matter. */
	ckh->count = 0;

	/*
	 * Find the minimum power of 2 that is large enough to fit minitems
	 * entries.  We are using (2+,2) cuckoo hashing, which has an expected
	 * maximum load factor of at least ~0.86, so 0.75 is a conservative load
	 * factor that will typically allow mincells items to fit without ever
	 * growing the table.
	 */
	assert(LG_CKH_BUCKET_CELLS > 0);
	mincells = ((minitems + (3 - (minitems % 3))) / 3) << 2;
	for (lg_mincells = LG_CKH_BUCKET_CELLS;
	    (ZU(1) << lg_mincells) < mincells;
	    lg_mincells++) {
		/* Do nothing. */
	}
	ckh->lg_minbuckets = lg_mincells - LG_CKH_BUCKET_CELLS;
	ckh->lg_curbuckets = lg_mincells - LG_CKH_BUCKET_CELLS;
	ckh->hash = hash;
	ckh->keycomp = keycomp;

	usize = sz_sa2u(sizeof(ckhc_t) << lg_mincells, CACHELINE);
	if (unlikely(usize == 0 || usize > SC_LARGE_MAXCLASS)) {
		ret = true;
		goto label_return;
	}
	ckh->tab = (ckhc_t *)ipallocztm(tsd_tsdn(tsd), usize, CACHELINE, true,
	    NULL, true, arena_ichoose(tsd, NULL));
	if (ckh->tab == NULL) {
		ret = true;
		goto label_return;
	}

	ret = false;
label_return:
	return ret;
}